

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O0

O3DGCErrorCode
o3dgc::LoadUIntAC(Vector<long> *data,unsigned_long M,BinaryStream *bstream,unsigned_long *iterator)

{
  uint uVar1;
  unsigned_long uVar2;
  unsigned_long size_00;
  unsigned_long uVar3;
  long local_d8;
  ulong local_d0;
  unsigned_long i;
  Adaptive_Data_Model mModelValues;
  undefined1 local_80 [8];
  Arithmetic_Codec acd;
  uchar *buffer;
  long minValue;
  unsigned_long size;
  unsigned_long sizeSize;
  unsigned_long *iterator_local;
  BinaryStream *bstream_local;
  unsigned_long M_local;
  Vector<long> *data_local;
  
  uVar2 = BinaryStream::ReadUInt32Bin(bstream,iterator);
  size_00 = BinaryStream::ReadUInt32Bin(bstream,iterator);
  if (size_00 != 0) {
    uVar3 = BinaryStream::ReadUInt32Bin(bstream,iterator);
    acd.mode = 0;
    acd._44_4_ = 0;
    BinaryStream::GetBuffer(bstream,*iterator,(uchar **)&acd.mode);
    *iterator = *iterator + (uVar2 - 0xc);
    Vector<long>::Allocate(data,size_00);
    Arithmetic_Codec::Arithmetic_Codec((Arithmetic_Codec *)local_80);
    size._0_4_ = (uint)(uVar2 - 0xc);
    Arithmetic_Codec::set_buffer((Arithmetic_Codec *)local_80,(uint)size,(uchar *)acd._40_8_);
    Arithmetic_Codec::start_decoder((Arithmetic_Codec *)local_80);
    bstream_local._0_4_ = (int)M;
    Adaptive_Data_Model::Adaptive_Data_Model((Adaptive_Data_Model *)&i,(int)bstream_local + 1);
    for (local_d0 = 0; local_d0 < size_00; local_d0 = local_d0 + 1) {
      uVar1 = Arithmetic_Codec::decode((Arithmetic_Codec *)local_80,(Adaptive_Data_Model *)&i);
      local_d8 = uVar1 + uVar3;
      Vector<long>::PushBack(data,&local_d8);
    }
    Adaptive_Data_Model::~Adaptive_Data_Model((Adaptive_Data_Model *)&i);
    Arithmetic_Codec::~Arithmetic_Codec((Arithmetic_Codec *)local_80);
  }
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    LoadUIntAC(Vector<long> & data,
                                 const unsigned long M,
                                 const BinaryStream & bstream,
                                 unsigned long & iterator) 
    {
        unsigned long sizeSize = bstream.ReadUInt32Bin(iterator) - 12;
        unsigned long size     = bstream.ReadUInt32Bin(iterator);
        if (size == 0)
        {
            return O3DGC_OK;
        }
        long minValue   = bstream.ReadUInt32Bin(iterator);
        unsigned char * buffer = 0;
        bstream.GetBuffer(iterator, buffer);
        iterator += sizeSize;
        data.Allocate(size);
        Arithmetic_Codec acd;
        acd.set_buffer(sizeSize, buffer);
        acd.start_decoder();
        Adaptive_Data_Model mModelValues(M+1);
#ifdef DEBUG_VERBOSE
        printf("-----------\nsize %i\n", size);
        fprintf(g_fileDebugTF, "size %i\n", size);
#endif //DEBUG_VERBOSE
        for(unsigned long i = 0; i < size; ++i)
        {
            data.PushBack(acd.decode(mModelValues)+minValue);
#ifdef DEBUG_VERBOSE
            printf("%i\t%i\n", i, data[i]);
            fprintf(g_fileDebugTF, "%i\t%i\n", i, data[i]);
#endif //DEBUG_VERBOSE
        }
        return O3DGC_OK;
    }